

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::anon_unknown_26::AssertionPrinter::printIssue(AssertionPrinter *this,char *issue)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(this->stream,' ');
  std::operator<<(poVar1,issue);
  return;
}

Assistant:

void printIssue(char const* issue) const {
        stream << ' ' << issue;
    }